

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionCube<double,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionCube<double,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double **transitionMatrices,int count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  ulong uVar18;
  double *pdVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  
  uVar17 = (this->super_EigenDecomposition<double,_1>).kStateCount;
  uVar23 = uVar17 + 3;
  if (-1 < (int)uVar17) {
    uVar23 = uVar17;
  }
  if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar18 = 0;
      auVar42 = ZEXT1664(ZEXT816(0));
      do {
        if (0 < (this->super_EigenDecomposition<double,_1>).kCategoryCount) {
          pdVar9 = transitionMatrices[probabilityIndices[uVar18]];
          lVar20 = 0;
          iVar29 = 0;
          do {
            uVar22 = (this->super_EigenDecomposition<double,_1>).kStateCount;
            if (0 < (int)uVar22) {
              lVar28 = 0;
              do {
                dVar30 = exp((this->super_EigenDecomposition<double,_1>).gEigenValues
                             [eigenIndices[lVar20]][lVar28] * edgeLengths[uVar18]);
                (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar28] = dVar30;
                lVar28 = lVar28 + 1;
                uVar22 = (this->super_EigenDecomposition<double,_1>).kStateCount;
              } while (lVar28 < (int)uVar22);
              auVar42 = ZEXT864(0) << 0x40;
            }
            if (0 < (int)uVar22) {
              pdVar19 = this->gCMatrices[eigenIndices[lVar20]];
              uVar24 = 0;
              do {
                pdVar10 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                uVar25 = 0;
                lVar28 = (long)iVar29;
                do {
                  lVar26 = lVar28;
                  if ((int)uVar17 < 4) {
                    uVar27 = 0;
                    auVar33 = ZEXT1664(ZEXT816(0));
                  }
                  else {
                    auVar33 = ZEXT1664(ZEXT816(0));
                    uVar27 = 0;
                    do {
                      auVar34._8_8_ = 0;
                      auVar34._0_8_ = pdVar19[uVar27];
                      auVar38._8_8_ = 0;
                      auVar38._0_8_ = pdVar19[uVar27 + 1];
                      auVar36._8_8_ = 0;
                      auVar36._0_8_ = pdVar10[uVar27];
                      auVar36 = vfmadd132sd_fma(auVar34,auVar33._0_16_,auVar36);
                      auVar1._8_8_ = 0;
                      auVar1._0_8_ = pdVar10[uVar27 + 1];
                      auVar36 = vfmadd231sd_fma(auVar36,auVar38,auVar1);
                      auVar39._8_8_ = 0;
                      auVar39._0_8_ = pdVar19[uVar27 + 2];
                      auVar2._8_8_ = 0;
                      auVar2._0_8_ = pdVar10[uVar27 + 2];
                      auVar36 = vfmadd132sd_fma(auVar39,auVar36,auVar2);
                      auVar32._8_8_ = 0;
                      auVar32._0_8_ = pdVar19[uVar27 + 3];
                      auVar3._8_8_ = 0;
                      auVar3._0_8_ = pdVar10[uVar27 + 3];
                      auVar36 = vfmadd132sd_fma(auVar32,auVar36,auVar3);
                      auVar33 = ZEXT1664(auVar36);
                      uVar27 = uVar27 + 4;
                    } while ((long)uVar27 < (long)(int)(uVar23 & 0xfffffffc));
                  }
                  auVar36 = auVar33._0_16_;
                  if ((int)uVar27 < (int)uVar22) {
                    uVar27 = uVar27 & 0xffffffff;
                    do {
                      auVar35._8_8_ = 0;
                      auVar35._0_8_ = pdVar19[uVar27];
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = pdVar10[uVar27];
                      auVar36 = vfmadd231sd_fma(auVar33._0_16_,auVar35,auVar4);
                      auVar33 = ZEXT1664(auVar36);
                      uVar27 = uVar27 + 1;
                    } while (uVar22 != uVar27);
                  }
                  auVar36 = vmaxsd_avx(auVar36,auVar42._0_16_);
                  pdVar19 = pdVar19 + uVar22;
                  pdVar9[lVar26] = auVar36._0_8_;
                  uVar25 = uVar25 + 1;
                  lVar28 = lVar26 + 1;
                } while (uVar25 != uVar22);
                pdVar9[(int)(lVar26 + 1)] = 1.0;
                iVar29 = (int)lVar26 + 2;
                uVar24 = uVar24 + 1;
              } while (uVar24 != uVar22);
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < (this->super_EigenDecomposition<double,_1>).kCategoryCount);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != (uint)count);
    }
  }
  else if (secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar18 = 0;
      auVar42 = ZEXT1664(ZEXT816(0));
      do {
        if (0 < (this->super_EigenDecomposition<double,_1>).kCategoryCount) {
          pdVar9 = transitionMatrices[probabilityIndices[uVar18]];
          pdVar19 = transitionMatrices[firstDerivativeIndices[uVar18]];
          lVar20 = 0;
          iVar29 = 0;
          do {
            uVar17 = (this->super_EigenDecomposition<double,_1>).kStateCount;
            if (0 < (int)uVar17) {
              lVar28 = 0;
              do {
                dVar30 = (this->super_EigenDecomposition<double,_1>).gEigenValues
                         [eigenIndices[lVar20]][lVar28];
                dVar31 = exp(dVar30 * edgeLengths[uVar18]);
                (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar28] = dVar31;
                (this->super_EigenDecomposition<double,_1>).firstDerivTmp[lVar28] = dVar31 * dVar30;
                lVar28 = lVar28 + 1;
                uVar17 = (this->super_EigenDecomposition<double,_1>).kStateCount;
              } while (lVar28 < (int)uVar17);
              auVar42 = ZEXT864(0) << 0x40;
            }
            if (0 < (int)uVar17) {
              iVar8 = eigenIndices[lVar20];
              uVar23 = 0;
              lVar28 = 0;
              do {
                pdVar10 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                pdVar11 = (this->super_EigenDecomposition<double,_1>).firstDerivTmp;
                pdVar12 = this->gCMatrices[iVar8];
                uVar22 = 0;
                lVar26 = (long)iVar29;
                do {
                  lVar21 = lVar26;
                  auVar33 = ZEXT864(0) << 0x40;
                  uVar27 = 0;
                  auVar36 = ZEXT816(0) << 0x40;
                  do {
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = pdVar12[(long)(int)lVar28 + uVar27];
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = pdVar10[uVar27];
                    auVar36 = vfmadd231sd_fma(auVar36,auVar40,auVar15);
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = pdVar11[uVar27];
                    auVar15 = vfmadd231sd_fma(auVar33._0_16_,auVar40,auVar16);
                    auVar33 = ZEXT1664(auVar15);
                    uVar27 = uVar27 + 1;
                  } while (uVar17 != uVar27);
                  lVar28 = (long)(int)lVar28 + (ulong)uVar17;
                  auVar36 = vmaxsd_avx(auVar36,auVar42._0_16_);
                  pdVar9[lVar21] = auVar36._0_8_;
                  pdVar19[lVar21] = auVar15._0_8_;
                  uVar22 = uVar22 + 1;
                  lVar26 = lVar21 + 1;
                } while (uVar22 != uVar17);
                iVar29 = (int)(lVar21 + 1);
                pdVar9[iVar29] = 1.0;
                pdVar19[iVar29] = 0.0;
                iVar29 = (int)lVar21 + 2;
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar17);
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < (this->super_EigenDecomposition<double,_1>).kCategoryCount);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != (uint)count);
    }
  }
  else if (0 < count) {
    auVar42 = ZEXT864(0) << 0x40;
    uVar18 = 0;
    do {
      if (0 < (this->super_EigenDecomposition<double,_1>).kCategoryCount) {
        pdVar9 = transitionMatrices[probabilityIndices[uVar18]];
        pdVar19 = transitionMatrices[firstDerivativeIndices[uVar18]];
        pdVar10 = transitionMatrices[secondDerivativeIndices[uVar18]];
        lVar20 = 0;
        iVar29 = 0;
        do {
          uVar17 = (this->super_EigenDecomposition<double,_1>).kStateCount;
          if (0 < (int)uVar17) {
            lVar28 = 0;
            do {
              dVar30 = (this->super_EigenDecomposition<double,_1>).gEigenValues
                       [eigenIndices[lVar20]][lVar28];
              dVar31 = exp(dVar30 * edgeLengths[uVar18]);
              (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar28] = dVar31;
              (this->super_EigenDecomposition<double,_1>).firstDerivTmp[lVar28] = dVar30 * dVar31;
              (this->super_EigenDecomposition<double,_1>).secondDerivTmp[lVar28] =
                   dVar30 * dVar30 * dVar31;
              lVar28 = lVar28 + 1;
              uVar17 = (this->super_EigenDecomposition<double,_1>).kStateCount;
            } while (lVar28 < (int)uVar17);
            auVar42 = ZEXT864(0) << 0x40;
          }
          if (0 < (int)uVar17) {
            iVar8 = eigenIndices[lVar20];
            uVar23 = 0;
            lVar28 = 0;
            do {
              pdVar11 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
              pdVar12 = (this->super_EigenDecomposition<double,_1>).firstDerivTmp;
              pdVar13 = (this->super_EigenDecomposition<double,_1>).secondDerivTmp;
              pdVar14 = this->gCMatrices[iVar8];
              uVar22 = 0;
              lVar26 = (long)iVar29;
              do {
                lVar21 = lVar26;
                auVar33 = ZEXT864(0) << 0x40;
                uVar27 = 0;
                auVar37 = ZEXT864(0) << 0x40;
                auVar36 = ZEXT816(0) << 0x40;
                do {
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = pdVar14[(long)(int)lVar28 + uVar27];
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = pdVar11[uVar27];
                  auVar36 = vfmadd231sd_fma(auVar36,auVar41,auVar5);
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = pdVar12[uVar27];
                  auVar15 = vfmadd231sd_fma(auVar37._0_16_,auVar41,auVar6);
                  auVar37 = ZEXT1664(auVar15);
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = pdVar13[uVar27];
                  auVar16 = vfmadd231sd_fma(auVar33._0_16_,auVar41,auVar7);
                  auVar33 = ZEXT1664(auVar16);
                  uVar27 = uVar27 + 1;
                } while (uVar17 != uVar27);
                lVar28 = (long)(int)lVar28 + (ulong)uVar17;
                auVar36 = vmaxsd_avx(auVar36,auVar42._0_16_);
                pdVar9[lVar21] = auVar36._0_8_;
                pdVar19[lVar21] = auVar15._0_8_;
                pdVar10[lVar21] = auVar16._0_8_;
                uVar22 = uVar22 + 1;
                lVar26 = lVar21 + 1;
              } while (uVar22 != uVar17);
              iVar29 = (int)(lVar21 + 1);
              pdVar9[iVar29] = 1.0;
              pdVar19[iVar29] = 0.0;
              pdVar10[iVar29] = 0.0;
              iVar29 = (int)lVar21 + 2;
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar17);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < (this->super_EigenDecomposition<double,_1>).kCategoryCount);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL													  
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
													  
	if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL) {
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
                for (int i = 0; i < kStateCount; i++) {
					matrixTmp[i] = exp(gEigenValues[eigenIndices[l]][i] * ((REALTYPE)edgeLengths[u]));
                }
				
                REALTYPE* tmpCMatrices = gCMatrices[eigenIndices[l]];
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
#ifdef UNROLL						
						int k = 0;
						for (; k < stateCountModFour; k += 4) {
							sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
							sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
							sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
							sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
						}
						for (; k < kStateCount; k++) {
							sum += tmpCMatrices[k] * matrixTmp[k];
						}
						tmpCMatrices += kStateCount;
#else
						for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif						
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
					n += T_PAD;
}
				}
			}
			
			if (DEBUGGING_OUTPUT) {
                int kMatrixSize = kStateCount * kStateCount;
				fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
				for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
					fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
			}
		}
        

	} else if (secondDerivativeIndices == NULL) {
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
				for (int i = 0; i < kStateCount; i++) {
					REALTYPE scaledEigenValue = gEigenValues[eigenIndices[l]][i];
					matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
					firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
				}
				
				int m = 0;
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
						REALTYPE sumD1 = 0.0;
						for (int k = 0; k < kStateCount; k++) {
							sum += gCMatrices[eigenIndices[l]][m] * matrixTmp[k];
							sumD1 += gCMatrices[eigenIndices[l]][m] * firstDerivTmp[k];
							m++;
						}
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						firstDerivMat[n] = sumD1;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
                    firstDerivMat[n] = 0.0;
					n += T_PAD;
}
				}
			}
		}
	} else {		
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
			REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
				for (int i = 0; i < kStateCount; i++) {
					REALTYPE scaledEigenValue = gEigenValues[eigenIndices[l]][i];
					matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
					firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
					secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
				}
				
				int m = 0;
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
						REALTYPE sumD1 = 0.0;
						REALTYPE sumD2 = 0.0;
						for (int k = 0; k < kStateCount; k++) {
							sum += gCMatrices[eigenIndices[l]][m] * matrixTmp[k];
							sumD1 += gCMatrices[eigenIndices[l]][m] * firstDerivTmp[k];
							sumD2 += gCMatrices[eigenIndices[l]][m] * secondDerivTmp[k];
							m++;
						}
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						firstDerivMat[n] = sumD1;
						secondDerivMat[n] = sumD2;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
                    firstDerivMat[n] = 0.0;
                    secondDerivMat[n] = 0.0;
					n += T_PAD;
}
				}
			}
		}
	}
}